

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumnsFlags IVar1;
  ImGuiColumns *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ImGuiColumns *pIVar7;
  byte bVar8;
  ImGuiColumns local_80;
  
  bVar8 = 0;
  lVar5 = (long)(window->ColumnsStorage).Size;
  if (0 < lVar5) {
    pIVar2 = (window->ColumnsStorage).Data;
    do {
      if (pIVar2->ID == id) {
        return pIVar2;
      }
      pIVar2 = pIVar2 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  ImGuiColumns::ImGuiColumns(&local_80);
  iVar4 = (window->ColumnsStorage).Size;
  if (iVar4 == (window->ColumnsStorage).Capacity) {
    if (iVar4 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar3) {
      iVar6 = iVar3;
    }
    pIVar2 = (ImGuiColumns *)MemAlloc((long)iVar6 * 0x60);
    pIVar7 = (window->ColumnsStorage).Data;
    if (pIVar7 != (ImGuiColumns *)0x0) {
      memcpy(pIVar2,pIVar7,(long)(window->ColumnsStorage).Size * 0x60);
      MemFree((window->ColumnsStorage).Data);
    }
    (window->ColumnsStorage).Data = pIVar2;
    (window->ColumnsStorage).Capacity = iVar6;
    iVar4 = (window->ColumnsStorage).Size;
  }
  else {
    pIVar2 = (window->ColumnsStorage).Data;
  }
  pIVar7 = &local_80;
  pIVar2 = pIVar2 + iVar4;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    IVar1 = pIVar7->Flags;
    pIVar2->ID = pIVar7->ID;
    pIVar2->Flags = IVar1;
    pIVar7 = (ImGuiColumns *)((long)pIVar7 + ((ulong)bVar8 * -2 + 1) * 8);
    pIVar2 = (ImGuiColumns *)((long)pIVar2 + (ulong)bVar8 * -0x10 + 8);
  }
  iVar4 = (window->ColumnsStorage).Size + 1;
  (window->ColumnsStorage).Size = iVar4;
  if (local_80.Columns.Data != (ImGuiColumnData *)0x0) {
    MemFree(local_80.Columns.Data);
    iVar4 = (window->ColumnsStorage).Size;
  }
  pIVar2 = (window->ColumnsStorage).Data + (long)iVar4 + -1;
  pIVar2->ID = id;
  return pIVar2;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}